

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2AddrModeImm8s4(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus DVar4;
  uint64_t in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  uint imm;
  uint Rn;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc8;
  uint Val_00;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,9,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0,9);
  DVar4 = DecodeGPRRegisterClass
                    ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     (uint)((ulong)in_RDX >> 0x20),in_RCX,(void *)CONCAT44(local_4,uVar2));
  Val_00 = (uint)(in_RCX >> 0x20);
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
  if (_Var1) {
    DVar4 = DecodeT2Imm8S4(in_RDX,Val_00,CONCAT44(local_4,uVar2),
                           (void *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm8s4(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 9, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 9);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2Imm8S4(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}